

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * get_cpu_name(void)

{
  char cVar1;
  char *pcVar2;
  FILE *__stream;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  __stream = fopen("/proc/cpuinfo","r");
  pcVar3 = fgets(get_cpu_name::buffer,0x200,__stream);
  pcVar6 = "Unknown";
  while (pcVar3 != (char *)0x0) {
    pcVar3 = strstr(get_cpu_name::buffer,"model name");
    if (pcVar3 != (char *)0x0) {
      pcVar3 = strchr(get_cpu_name::buffer,0x3a);
      if (pcVar3 != (char *)0x0) {
        ppuVar4 = __ctype_b_loc();
        pcVar2 = pcVar3 + 3;
        pcVar7 = pcVar3 + 1;
        do {
          pcVar6 = pcVar7;
          pcVar5 = pcVar2;
          pcVar7 = pcVar6 + 1;
          pcVar2 = pcVar5 + 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
        cVar1 = *pcVar7;
        while (cVar1 != '\0') {
          if (((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) ||
             ((*(byte *)((long)*ppuVar4 + (long)pcVar7[-1] * 2 + 1) & 0x20) == 0)) {
            *pcVar7 = cVar1;
            pcVar7 = pcVar7 + 1;
          }
          cVar1 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        }
        *pcVar7 = '\0';
      }
      if (pcVar3 != (char *)0x0) break;
    }
    pcVar3 = fgets(get_cpu_name::buffer,0x200,__stream);
  }
  fclose(__stream);
  return pcVar6;
}

Assistant:

const char *
get_cpu_name (void)
{
	const char *name = "Unknown", *search = NULL ;
	static char buffer [512] ;
	FILE * file = NULL ;
	int is_pipe = 0 ;

#if defined (__linux__)
	file = fopen ("/proc/cpuinfo", "r") ;
	search = "model name" ;
#elif defined (__APPLE__)
	file = popen ("/usr/sbin/system_profiler -detailLevel full SPHardwareDataType", "r") ;
	search = "Processor Name" ;
	is_pipe = 1 ;
#elif defined (__FreeBSD__) || defined (__OpenBSD__)
	file = popen ("sysctl -a", "r") ;
	search = "hw.model" ;
	is_pipe = 1 ;
#else
	(void) search ;
	(void) buffer ;
	(void) file ;
	(void) is_pipe ;

	return name;
#endif

#if defined (__linux__) || defined (__APPLE__) || defined (__FreeBSD__) || defined (__OpenBSD__)
	if (search == NULL)
	{	printf ("Error : search is NULL in function %s.\n", __func__) ;
		return name ;
		} ;

	while (fgets (buffer, sizeof (buffer), file) != NULL)
		if (strstr (buffer, search))
		{	char *src, *dest ;

			if ((src = strchr (buffer, ':')) != NULL)
			{	src ++ ;
				while (isspace (src [0]))
					src ++ ;
				name = src ;

				/* Remove consecutive spaces. */
				src ++ ;
				for (dest = src ; src [0] ; src ++)
				{	if (isspace (src [0]) && isspace (dest [-1]))
						continue ;
					dest [0] = src [0] ;
					dest ++ ;
					} ;
				dest [0] = 0 ;
				break ;
				} ;
			} ;

	if (is_pipe)
		pclose (file) ;
	else
		fclose (file) ;

	return name ;
#endif
}